

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Scanner::Scanner(Scanner *this,char *input_f)

{
  FILE *pFVar1;
  Exception *this_00;
  allocator<Lex> local_35 [17];
  Lex local_24;
  char *local_18;
  char *input_f_local;
  Scanner *this_local;
  
  local_18 = input_f;
  input_f_local = (char *)this;
  std::__cxx11::string::string((string *)&this->buffer);
  Lex::Lex(&local_24);
  std::allocator<Lex>::allocator(local_35);
  std::vector<Lex,_std::allocator<Lex>_>::vector(&this->lex_vec,0,&local_24,local_35);
  std::allocator<Lex>::~allocator(local_35);
  Lex::~Lex(&local_24);
  pFVar1 = fopen(local_18,"r");
  this->f = (FILE *)pFVar1;
  if (this->f == (FILE *)0x0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    Exception::Exception(this_00,"Scanner error: could not open file",'\0');
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  clear_buffer(this);
  this->STATE = H_ST;
  return;
}

Assistant:

Scanner::Scanner(const char* input_f): lex_vec(0, Lex()){
    f = fopen(input_f, "r");
    if(f == NULL) throw Exception("Scanner error: could not open file");
    clear_buffer();
    STATE = H_ST;
}